

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

uint32_t arm::register_num(Reg r)

{
  if (r < 0x10) {
    return r;
  }
  if (r < 0x30) {
    return r - 0x10;
  }
  if (r < 0x40) {
    return r - 0x30;
  }
  if (-1 < (int)r) {
    return r - 0x40;
  }
  if (r < 0xc0000000) {
    return r & 0x7fffffff;
  }
  return r + 0x40000000;
}

Assistant:

uint32_t register_num(Reg r) {
  if (r < 16)
    return r;
  else if (r < 48)
    return r - 16;
  else if (r < 64)
    return r - 48;
  else if (r < 1 << 31)
    return r - 64;
  else if (r < 3 << 30)
    return r - (1 << 31);
  else
    return r - (3 << 30);
}